

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

double wolfe_eval<sparse_parameters>
                 (vw *all,bfgs *b,float *mem,double loss_sum,double previous_loss_sum,
                 double step_size,double importance_weight_sum,int *origin,double *wolfe1,
                 sparse_parameters *weights)

{
  float fVar1;
  float fVar2;
  long lVar3;
  bool bVar4;
  uint32_t uVar5;
  float *pfVar6;
  int *in_RCX;
  int __c;
  long in_RDX;
  long in_RSI;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> *__s;
  long in_RDI;
  double *in_R8;
  sparse_parameters *in_R9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  iterator iVar7;
  double wolfe2;
  float *mem1;
  iterator w;
  double g1_g1;
  double g1_Hg1;
  double g1_d;
  double g0_d;
  sparse_iterator<float> *in_stack_fffffffffffffef8;
  sparse_parameters *in_stack_ffffffffffffff00;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_a0;
  uint32_t local_98;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_90;
  uint32_t local_88;
  sparse_iterator<float> local_80;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  sparse_parameters *local_50;
  double *local_48;
  int *local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_58 = 0.0;
  local_60 = 0.0;
  local_68 = 0.0;
  local_70 = 0.0;
  local_50 = in_R9;
  local_48 = in_R8;
  local_40 = in_RCX;
  local_38 = in_XMM3_Qa;
  local_30 = in_XMM2_Qa;
  local_28 = in_XMM1_Qa;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar7 = sparse_parameters::begin(in_stack_ffffffffffffff00);
  local_90._M_cur =
       (__node_type *)
       iVar7._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur;
  local_88 = iVar7._stride;
  local_80._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_90._M_cur;
  local_80._stride = local_88;
  while( true ) {
    iVar7 = sparse_parameters::end(in_stack_ffffffffffffff00);
    local_a0._M_cur =
         (__node_type *)
         iVar7._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_98 = iVar7._stride;
    __s = &local_a0;
    bVar4 = sparse_iterator<float>::operator!=
                      ((sparse_iterator<float> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8
                      );
    lVar3 = local_18;
    if (!bVar4) break;
    in_stack_ffffffffffffff00 =
         (sparse_parameters *)sparse_iterator<float>::index(&local_80,(char *)__s,__c);
    uVar5 = sparse_parameters::stride_shift(local_50);
    fVar1 = *(float *)(lVar3 + ((ulong)in_stack_ffffffffffffff00 >> ((byte)uVar5 & 0x3f)) *
                               (long)*(int *)(local_10 + 0xb4) * 4 +
                      (long)(*local_40 % *(int *)(local_10 + 0xb4)) * 4);
    pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x2462fb);
    local_58 = (double)fVar1 * (double)pfVar6[2] + local_58;
    pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x246331);
    fVar1 = pfVar6[1];
    pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24634d);
    local_60 = (double)fVar1 * (double)pfVar6[2] + local_60;
    pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x246383);
    fVar1 = pfVar6[1];
    pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24639f);
    fVar2 = pfVar6[1];
    pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x2463c5);
    local_68 = (double)fVar1 * (double)fVar2 * (double)pfVar6[3] + local_68;
    pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x2463fb);
    fVar1 = pfVar6[1];
    pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x246417);
    local_70 = (double)fVar1 * (double)pfVar6[1] + local_70;
    sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_ffffffffffffff00);
  }
  *local_48 = (local_20 - local_28) / (local_30 * local_58);
  if ((*(byte *)(local_8 + 0x3439) & 1) == 0) {
    fprintf(_stderr,"%-10.5f\t%-10.5f\t%s%-10f\t%-10f\t",local_70 / (local_38 * local_38),
            local_68 / local_38,*local_48,local_60 / local_58," ");
  }
  return local_30 * 0.5;
}

Assistant:

double wolfe_eval(vw& all, bfgs& b, float* mem, double loss_sum, double previous_loss_sum, double step_size,
    double importance_weight_sum, int& origin, double& wolfe1, T& weights)
{
  double g0_d = 0.;
  double g1_d = 0.;
  double g1_Hg1 = 0.;
  double g1_g1 = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    g0_d += ((double)mem1[(MEM_GT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    g1_d += ((double)(&(*w))[W_GT]) * (&(*w))[W_DIR];
    g1_Hg1 += ((double)(&(*w))[W_GT]) * (&(*w))[W_GT] * ((&(*w))[W_COND]);
    g1_g1 += ((double)(&(*w))[W_GT]) * (&(*w))[W_GT];
  }

  wolfe1 = (loss_sum - previous_loss_sum) / (step_size * g0_d);
  double wolfe2 = g1_d / g0_d;
  // double new_step_cross = (loss_sum-previous_loss_sum-g1_d*step)/(g0_d-g1_d);

  if (!all.quiet)
    fprintf(stderr, "%-10.5f\t%-10.5f\t%s%-10f\t%-10f\t", g1_g1 / (importance_weight_sum * importance_weight_sum),
        g1_Hg1 / importance_weight_sum, " ", wolfe1, wolfe2);
  return 0.5 * step_size;
}